

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeFunctionType(Builder *this,Id returnType,Vector<Id> *paramTypes)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  Id *pIVar3;
  iterator iVar4;
  iterator __position;
  Builder *pBVar5;
  pointer puVar6;
  Id IVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  Instruction *type;
  Instruction *local_50;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  Id local_3c;
  Builder *local_38;
  
  ppIVar2 = this->groupedTypes[0x21].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (uint)((ulong)((long)this->groupedTypes[0x21].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  bVar15 = 0 < (int)uVar8;
  if (0 < (int)uVar8) {
    puVar6 = (paramTypes->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (ulong)((long)(paramTypes->
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 2;
    iVar9 = (int)uVar10;
    uVar11 = 0;
    uVar12 = 0;
    if (0 < iVar9) {
      uVar12 = uVar10 & 0xffffffff;
    }
    do {
      local_50 = ppIVar2[uVar11];
      pIVar3 = (local_50->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((*pIVar3 == returnType) &&
         ((int)((ulong)((long)(local_50->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 2) + -1
          == iVar9)) {
        uVar10 = 0;
        do {
          uVar14 = uVar10;
          if (uVar12 == uVar14) {
            local_3c = local_50->resultId;
            break;
          }
          uVar10 = uVar14 + 1;
        } while (puVar6[uVar14] == pIVar3[uVar14 + 1]);
        if ((long)iVar9 <= (long)uVar14) break;
      }
      uVar11 = uVar11 + 1;
      bVar15 = uVar11 < (uVar8 & 0x7fffffff);
    } while (uVar11 != (uVar8 & 0x7fffffff));
  }
  if (!bVar15) {
    local_38 = this;
    local_50 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar7 = local_38->uniqueId + 1;
    local_38->uniqueId = IVar7;
    local_50->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    local_50->resultId = IVar7;
    local_50->typeId = 0;
    local_50->opCode = OpTypeFunction;
    (local_50->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_50->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_50->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50->block = (Block *)0x0;
    local_48._M_head_impl._0_4_ = returnType;
    iVar4._M_current =
         (local_50->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (local_50->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_50->operands,iVar4,(uint *)&local_48);
    }
    else {
      *iVar4._M_current = returnType;
      (local_50->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    puVar6 = (paramTypes->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(paramTypes->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 2)) {
      lVar13 = 0;
      do {
        local_48._M_head_impl._0_4_ = puVar6[lVar13];
        iVar4._M_current =
             (local_50->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (local_50->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                     &local_50->operands,iVar4,(uint *)&local_48);
        }
        else {
          *iVar4._M_current = puVar6[lVar13];
          (local_50->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        lVar13 = lVar13 + 1;
        puVar6 = (paramTypes->
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar13 < (int)((ulong)((long)(paramTypes->
                                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar6) >> 2));
    }
    pBVar5 = local_38;
    __position._M_current =
         local_38->groupedTypes[0x21].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        local_38->groupedTypes[0x21].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>
                ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
                 (local_38->groupedTypes + 0x21),__position,&local_50);
    }
    else {
      *__position._M_current = local_50;
      pppIVar1 = &local_38->groupedTypes[0x21].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    local_48._M_head_impl = local_50;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar5->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_48);
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&pBVar5->module,local_50);
    local_3c = local_50->resultId;
  }
  return local_3c;
}

Assistant:

Id Builder::makeFunctionType(Id returnType, const dxil_spv::Vector<Id>& paramTypes)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeFunction].size(); ++t) {
        type = groupedTypes[OpTypeFunction][t];
        if (type->getIdOperand(0) != returnType || (int)paramTypes.size() != type->getNumOperands() - 1)
            continue;
        bool mismatch = false;
        for (int p = 0; p < (int)paramTypes.size(); ++p) {
            if (paramTypes[p] != type->getIdOperand(p + 1)) {
                mismatch = true;
                break;
            }
        }
        if (! mismatch)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeFunction);
    type->addIdOperand(returnType);
    for (int p = 0; p < (int)paramTypes.size(); ++p)
        type->addIdOperand(paramTypes[p]);
    groupedTypes[OpTypeFunction].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}